

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

char * INT_EVmaster_get_contact_list(EVmaster master)

{
  undefined4 uVar1;
  undefined4 uVar2;
  CManager_conflict p_Var3;
  char *pcVar4;
  attr_list in_stack_00000010;
  attr_list listen_list;
  atom_t CM_TRANSPORT;
  atom_t CM_ENET_CONN_TIMEOUT;
  char *tmp;
  CManager_conflict cm;
  attr_list contact_list;
  CManager_conflict in_stack_ffffffffffffffb8;
  CManager_conflict cm_00;
  char *local_20;
  attr_list local_10;
  
  local_20 = (char *)0x0;
  uVar1 = attr_atom_from_string("CM_ENET_CONN_TIMEOUT");
  uVar2 = attr_atom_from_string("CM_TRANSPORT");
  p_Var3 = (CManager_conflict)create_attr_list();
  cm_00 = p_Var3;
  pcVar4 = strdup("enet");
  add_string_attr(cm_00,uVar2,pcVar4);
  local_10 = INT_CMget_specific_contact_list((CManager_conflict)listen_list,in_stack_00000010);
  if (local_10 != (attr_list)0x0) {
    add_int_attr(local_10,uVar1,60000);
  }
  free_attr_list(p_Var3);
  if ((local_10 == (attr_list)0x0) &&
     (local_10 = INT_CMget_contact_list(in_stack_ffffffffffffffb8), local_10 == (attr_list)0x0)) {
    CMlisten(cm_00);
    local_10 = INT_CMget_contact_list(in_stack_ffffffffffffffb8);
  }
  if (local_10 != (attr_list)0x0) {
    local_20 = (char *)attr_list_to_string(local_10);
  }
  free_attr_list(local_10);
  return local_20;
}

Assistant:

extern char *INT_EVmaster_get_contact_list(EVmaster master)
{
    attr_list contact_list = NULL;
    CManager cm = master->cm;
    char *tmp = NULL;

    /* use enet transport if available */
#if defined(ENET_FOUND) || defined(ZPL_ENET_AVAILABLE)
    atom_t CM_ENET_CONN_TIMEOUT = attr_atom_from_string("CM_ENET_CONN_TIMEOUT");
    atom_t CM_TRANSPORT = attr_atom_from_string("CM_TRANSPORT");
    (void) CM_TRANSPORT;
    attr_list listen_list = create_attr_list();
#if defined(ENET_FOUND)
    add_string_attr(listen_list, CM_TRANSPORT, strdup("enet"));
#elif defined(ZPL_ENET_AVAILABLE)
    add_string_attr(listen_list, CM_TRANSPORT, strdup("zplenet"));
#endif
    /* and kick up the connection timeout value.  We can wait 60 secs */
    contact_list = INT_CMget_specific_contact_list(cm, listen_list);
    if(contact_list) {
        add_int_attr(contact_list, CM_ENET_CONN_TIMEOUT, 60000);
    }
    free_attr_list(listen_list);
#endif

    if (contact_list == NULL) {
	contact_list = INT_CMget_contact_list(cm);
	if (contact_list == NULL) {
	    CMlisten(cm);
	    contact_list = INT_CMget_contact_list(cm);
	}
    }
    if(contact_list) {
        tmp = attr_list_to_string(contact_list);
    }
    free_attr_list(contact_list);
    return tmp;
}